

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O0

offset_in_this_suite_class_to_subr
agge::tests::RoundedRectangleTests::__IteratorListsItsVertices_meta(char **name)

{
  char **name_local;
  
  *name = "IteratorListsItsVertices";
  return (offset_in_this_suite_class_to_subr)IteratorListsItsVertices;
}

Assistant:

test( IteratorListsItsVertices )
			{
				// INIT
				real_t x, y;
				vector<point_r> points;

				// INIT / ACT
				rounded_rectangle r1(10.0f, 20.0f, 30.0f, 35.0f, 5.0f);

				// ACT
				while ((path_command_end_poly | path_flag_close) != r1.vertex(&x, &y))
					points.push_back(create_point(x, y));

				// ASSERT
				vector<point_r> part;
				size_t part_size = points.size() / 4;

				assert_equal(0u, points.size() % 4);

				part.assign(points.begin() + 0 * part_size, points.begin() + 1 * part_size);
				assert_equal(create_point(10.0f, 25.0f), part.front());
				assert_points_on_circle(15.0f, 25.0f, 5.0f, part);
				assert_equal(create_point(15.0f, 20.0f), part.back());

				part.assign(points.begin() + 1 * part_size, points.begin() + 2 * part_size);
				assert_equal(create_point(25.0f, 20.0f), part.front());
				assert_points_on_circle(25.0f, 25.0f, 5.0f, part);
				assert_equal(create_point(30.0f, 25.0f), part.back());

				part.assign(points.begin() + 2 * part_size, points.begin() + 3 * part_size);
				assert_equal(create_point(30.0f, 30.0f), part.front());
				assert_points_on_circle(25.0f, 30.0f, 5.0f, part);
				assert_equal(create_point(25.0f, 35.0f), part.back());

				part.assign(points.begin() + 3 * part_size, points.begin() + 4 * part_size);
				assert_equal(create_point(15.0f, 35.0f), part.front());
				assert_points_on_circle(15.0f, 30.0f, 5.0f, part);
				assert_equal(create_point(10.0f, 30.0f), part.back());

				// INIT
				points.clear();

				// INIT / ACT
				rounded_rectangle r2(0.0f, 0.0f, 40.0f, 10.0f, 3.5f);

				// ACT
				while ((path_command_end_poly | path_flag_close) != r2.vertex(&x, &y))
					points.push_back(create_point(x, y));

				// ASSERT
				part_size = points.size() / 4;

				assert_equal(0u, points.size() % 4);

				part.assign(points.begin() + 0 * part_size, points.begin() + 1 * part_size);
				assert_points_on_circle(3.5f, 3.5f, 3.5f, part);

				part.assign(points.begin() + 1 * part_size, points.begin() + 2 * part_size);
				assert_points_on_circle(36.5f, 3.5f, 3.5f, part);

				part.assign(points.begin() + 2 * part_size, points.begin() + 3 * part_size);
				assert_points_on_circle(36.5f, 6.5f, 3.5f, part);

				part.assign(points.begin() + 3 * part_size, points.begin() + 4 * part_size);
				assert_points_on_circle(3.5f, 6.5f, 3.5f, part);
			}